

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O2

void __thiscall
tf::UnboundedTaskQueue<tf::Node_*>::~UnboundedTaskQueue(UnboundedTaskQueue<tf::Node_*> *this)

{
  pointer ppAVar1;
  Array *pAVar2;
  pointer ppAVar3;
  
  ppAVar1 = (this->_garbage).
            super__Vector_base<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar3 = (this->_garbage).
                 super__Vector_base<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppAVar3 != ppAVar1;
      ppAVar3 = ppAVar3 + 1) {
    pAVar2 = *ppAVar3;
    if (pAVar2 != (Array *)0x0) {
      Array::~Array(pAVar2);
    }
    operator_delete(pAVar2,0x18);
  }
  pAVar2 = (this->_array)._M_b._M_p;
  if (pAVar2 != (Array *)0x0) {
    Array::~Array(pAVar2);
  }
  operator_delete(pAVar2,0x18);
  std::
  _Vector_base<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  ::~_Vector_base(&(this->_garbage).
                   super__Vector_base<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
                 );
  return;
}

Assistant:

UnboundedTaskQueue<T>::~UnboundedTaskQueue() {
  for(auto a : _garbage) {
    delete a;
  }
  delete _array.load();
}